

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_Downloader.h
# Opt level: O2

void __thiscall Ui_Downloader::retranslateUi(Ui_Downloader *this,QWidget *Downloader)

{
  QLabel *pQVar1;
  QPushButton *pQVar2;
  QArrayDataPointer<char16_t> local_38;
  
  QCoreApplication::translate((char *)&local_38,"Downloader","Updater",0);
  QWidget::setWindowTitle((QString *)Downloader);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QLabel::setText((QString *)this->updater_icon);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar1 = this->downloadLabel;
  QCoreApplication::translate((char *)&local_38,"Downloader","Downloading updates",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar1 = this->timeLabel;
  QCoreApplication::translate((char *)&local_38,"Downloader","Time remaining: 0 minutes",0);
  QLabel::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar2 = this->openButton;
  QCoreApplication::translate((char *)&local_38,"Downloader","Open",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  pQVar2 = this->stopButton;
  QCoreApplication::translate((char *)&local_38,"Downloader","Stop",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  return;
}

Assistant:

void retranslateUi(QWidget *Downloader)
    {
        Downloader->setWindowTitle(QCoreApplication::translate("Downloader", "Updater", nullptr));
        updater_icon->setText(QString());
        downloadLabel->setText(QCoreApplication::translate("Downloader", "Downloading updates", nullptr));
        timeLabel->setText(QCoreApplication::translate("Downloader", "Time remaining: 0 minutes", nullptr));
        openButton->setText(QCoreApplication::translate("Downloader", "Open", nullptr));
        stopButton->setText(QCoreApplication::translate("Downloader", "Stop", nullptr));
    }